

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

timer_thread_unique_ptr_t __thiscall
so_5::create_timer_heap_thread(so_5 *this,error_logger_shptr_t *logger)

{
  size_t initial_heap_capacity;
  shared_ptr<so_5::error_logger_t> local_28;
  error_logger_shptr_t *local_18;
  error_logger_shptr_t *logger_local;
  
  local_18 = logger;
  logger_local = (error_logger_shptr_t *)this;
  std::shared_ptr<so_5::error_logger_t>::shared_ptr(&local_28,logger);
  initial_heap_capacity =
       timertt::details::timer_heap_engine_defaults::default_initial_heap_capacity();
  create_timer_heap_thread(this,&local_28,initial_heap_capacity);
  std::shared_ptr<so_5::error_logger_t>::~shared_ptr(&local_28);
  return (__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
          )(__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
            )this;
}

Assistant:

SO_5_FUNC timer_thread_unique_ptr_t
create_timer_heap_thread(
	error_logger_shptr_t logger )
	{
		using timertt_thread_t = timers_details::timer_heap_thread_t;

		return create_timer_heap_thread(
				logger,
				timertt_thread_t::default_initial_heap_capacity() );
	}